

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassUnqualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  string local_38;
  csharp *local_18;
  FileDescriptor *descriptor_local;
  
  local_18 = this;
  descriptor_local = (FileDescriptor *)__return_storage_ptr__;
  GetFileNameBase_abi_cxx11_(&local_38,this,descriptor);
  std::operator+(__return_storage_ptr__,&local_38,"Reflection");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassUnqualifiedName(const FileDescriptor* descriptor) {
  // TODO: Detect collisions with existing messages,
  // and append an underscore if necessary.
  return GetFileNameBase(descriptor) + "Reflection";
}